

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_ubo_reference.cpp
# Opt level: O3

ir_expression * __thiscall
anon_unknown.dwarf_7ab89::lower_ubo_reference_visitor::calculate_ssbo_unsized_array_length
          (lower_ubo_reference_visitor *this,ir_expression *expr)

{
  ir_node_type iVar1;
  ir_rvalue *deref;
  ir_variable *var;
  ir_expression *piVar2;
  
  if (expr->operation == ir_unop_ssbo_unsized_array_length) {
    deref = expr->operands[0];
    iVar1 = (deref->super_ir_instruction).ir_type;
    if (((deref != (ir_rvalue *)0x0 && iVar1 < ir_type_variable) &&
        (deref->type->field_0x4 == '\x11')) &&
       (iVar1 < ir_type_constant && deref->type->length == 0)) {
      var = (ir_variable *)
            (**(code **)&((ir_rvalue *)(deref->super_ir_instruction)._vptr_ir_instruction)[1].
                         super_ir_instruction.ir_type)(deref);
      if (((var != (ir_variable *)0x0) &&
          (((undefined1  [44])var->data & (undefined1  [44])0xf000) == (undefined1  [44])0x2000)) &&
         (var->interface_type != (glsl_type *)0x0)) {
        piVar2 = process_ssbo_unsized_array_length
                           (this,(ir_rvalue **)deref,(ir_dereference *)deref,var);
        return piVar2;
      }
    }
  }
  return (ir_expression *)0x0;
}

Assistant:

ir_expression *
lower_ubo_reference_visitor::calculate_ssbo_unsized_array_length(ir_expression *expr)
{
   if (expr->operation !=
       ir_expression_operation(ir_unop_ssbo_unsized_array_length))
      return NULL;

   ir_rvalue *rvalue = expr->operands[0]->as_rvalue();
   if (!rvalue ||
       !rvalue->type->is_array() || !rvalue->type->is_unsized_array())
      return NULL;

   ir_dereference *deref = expr->operands[0]->as_dereference();
   if (!deref)
      return NULL;

   ir_variable *var = expr->operands[0]->variable_referenced();
   if (!var || !var->is_in_shader_storage_block())
      return NULL;
   return process_ssbo_unsized_array_length(&rvalue, deref, var);
}